

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage(MemoryLeakDetector *this)

{
  void *memory;
  TestMemoryAllocator *allocator;
  MemoryLeakDetectorNode *leak;
  long lVar1;
  MemoryLeakDetectorNode *cur;
  
  lVar1 = 0;
  do {
    for (leak = (this->memoryTable_).table_[lVar1].head_;
        (leak != (MemoryLeakDetectorNode *)0x0 &&
        (leak[0x34] != (MemoryLeakDetectorNode)this->current_allocation_stage_));
        leak = *(MemoryLeakDetectorNode **)(leak + 0x38)) {
    }
    if (leak != (MemoryLeakDetectorNode *)0x0) goto joined_r0x001173fd;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x49);
  leak = (MemoryLeakDetectorNode *)0x0;
joined_r0x001173fd:
  while (leak != (MemoryLeakDetectorNode *)0x0) {
    memory = *(void **)(leak + 0x10);
    allocator = *(TestMemoryAllocator **)(leak + 0x28);
    leak = MemoryLeakDetectorTable::getNextLeakForAllocationStage
                     (&this->memoryTable_,leak,this->current_allocation_stage_);
    deallocMemory(this,allocator,memory,
                  "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O1/_deps/cpputest-src/src/CppUTest/MemoryLeakDetector.cpp"
                  ,0x2bf,false);
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage()
{
    char* memory = NULLPTR;
    MemoryLeakDetectorNode* node = memoryTable_.getFirstLeakForAllocationStage(current_allocation_stage_);
    while (node) {
        memory = node->memory_;
        TestMemoryAllocator* allocator = node->allocator_;
        node = memoryTable_.getNextLeakForAllocationStage(node, current_allocation_stage_);
        deallocMemory(allocator, memory, __FILE__, __LINE__);
    }
}